

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

unsigned_long __thiscall
lodepng::ExtractZlib::huffmanDecodeSymbol
          (ExtractZlib *this,uchar *in,size_t *bp,HuffmanTree *tree,size_t inlength)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  bool decoded;
  unsigned_long ct;
  size_t treepos;
  bool local_41;
  unsigned_long local_40;
  size_t local_38;
  
  local_38 = 0;
  while( true ) {
    uVar2 = *bp;
    if (inlength < uVar2 >> 3 && (uVar2 & 7) == 0) {
      this->error = 10;
      return 0;
    }
    bVar1 = in[uVar2 >> 3];
    *bp = uVar2 + 1;
    iVar3 = HuffmanTree::decode(tree,&local_41,&local_40,&local_38,
                                (ulong)((bVar1 >> ((uint)uVar2 & 7) & 1) != 0));
    this->error = iVar3;
    if (iVar3 != 0) break;
    if (local_41 == true) {
      return local_40;
    }
  }
  return 0;
}

Assistant:

unsigned long huffmanDecodeSymbol(const unsigned char* in, size_t& bp, const HuffmanTree& tree, size_t inlength) {
    //decode a single symbol from given list of bits with given code tree. return value is the symbol
    bool decoded; unsigned long ct;
    for(size_t treepos = 0;;) {
      if((bp & 0x07) == 0 && (bp >> 3) > inlength) { error = 10; return 0; } //error: end reached without endcode
      error = tree.decode(decoded, ct, treepos, readBitFromStream(bp, in));
      if(error) return 0; //stop, an error happened
      if(decoded) return ct;
    }
  }